

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_utils.c
# Opt level: O3

char * get_filename_no_ext(char *src,char path_separator)

{
  size_t sVar1;
  char *__dest;
  char *pcVar2;
  char *pcVar3;
  char *unaff_R12;
  
  if (src == (char *)0x0) {
    return (char *)0x0;
  }
  sVar1 = strlen(src);
  __dest = (char *)malloc(sVar1 + 1);
  if (__dest == (char *)0x0) {
    return (char *)0x0;
  }
  strcpy(__dest,src);
  pcVar2 = strrchr(__dest,0x2e);
  pcVar3 = strrchr(__dest,(int)path_separator);
  if (pcVar3 == (char *)0x0 || pcVar2 == (char *)0x0) {
    if (pcVar2 == (char *)0x0 || pcVar3 != (char *)0x0) {
      if (pcVar3 == (char *)0x0 || pcVar2 != (char *)0x0) goto LAB_00118faa;
LAB_00118f46:
      sVar1 = strlen(__dest);
      unaff_R12 = (char *)malloc((size_t)(__dest + (sVar1 - (long)pcVar3)));
      if (unaff_R12 == (char *)0x0) {
LAB_00118fb3:
        free(__dest);
        return (char *)0x0;
      }
      strncpy(unaff_R12,pcVar3 + 1,(size_t)(__dest + (sVar1 - (long)pcVar3)));
    }
    else {
      sVar1 = (long)pcVar2 - (long)__dest;
      unaff_R12 = (char *)malloc(sVar1 + 1);
      if (unaff_R12 == (char *)0x0) goto LAB_00118fb3;
      strncpy(unaff_R12,__dest,sVar1);
      unaff_R12[sVar1] = '\0';
    }
  }
  else {
    if (pcVar2 <= pcVar3) goto LAB_00118f46;
    sVar1 = (long)pcVar2 - (long)pcVar3;
    unaff_R12 = (char *)malloc(sVar1);
    if (unaff_R12 == (char *)0x0) goto LAB_00118fb3;
    strncpy(unaff_R12,pcVar3 + 1,sVar1 - 1);
    unaff_R12[sVar1 - 1] = '\0';
  }
  free(__dest);
LAB_00118faa:
  if (pcVar2 != (char *)0x0 || pcVar3 != (char *)0x0) {
    return unaff_R12;
  }
  return __dest;
}

Assistant:

char *get_filename_no_ext(char *src, char path_separator) {
    char *opstr, *retstr;
    char *lastdot;
    char *lastsep;

    if (src == NULL)
         return NULL;

    if ((opstr = malloc(strlen(src) + 1)) == NULL)
        return NULL;

    strcpy(opstr, src);

    lastdot = strrchr(opstr, '.');
    lastsep = strrchr(opstr, path_separator);

    if (lastdot && lastsep) {
        // printf("\n lastdot = %li; lastsep = %li; lastdot-lastsep = %li \n", lastdot - opstr, lastsep - opstr, lastdot - lastsep);
        if (lastsep < lastdot) {
            if ((retstr = malloc(lastdot - lastsep)) == NULL) {
                free(opstr);
                return NULL;
            }
            strncpy(retstr, lastsep + 1, lastdot - lastsep - 1);
            retstr[lastdot - lastsep - 1] = '\0';
            free(opstr);
        } else {
            if ((retstr = malloc(opstr + strlen(opstr) - lastsep)) == NULL) {
                free(opstr);
                return NULL;
            }

            strncpy(retstr, lastsep + 1, opstr + strlen(opstr) - lastsep);
            free(opstr);
        }
    }

    if (lastdot && !lastsep) {
        if ((retstr = malloc(lastdot - opstr + 1)) == NULL) {
            free(opstr);
            return NULL;
        }

        strncpy(retstr, opstr, lastdot - opstr);
        retstr[lastdot - opstr] = '\0';
        free(opstr);
    }

    if (!lastdot && lastsep) {
        if ((retstr = malloc(opstr + strlen(opstr) - lastsep)) == NULL) {
            free(opstr);
            return NULL;
        }

        strncpy(retstr, lastsep + 1, opstr + strlen(opstr) - lastsep);
        free(opstr);
    }

    if (!lastdot && !lastsep) {
        return opstr;
    }

    return retstr;
}